

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O1

TestCaseGroup * vkt::geometry::createVaryingGeometryShaderTests(TestContext *testCtx)

{
  int iVar1;
  TestNode *this;
  TestNode *node;
  long lVar2;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"varying","Test varyings.");
  if (createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests == '\0') {
    iVar1 = __cxa_guard_acquire(&createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests);
    if (iVar1 != 0) {
      createVaryingGeometryShaderTests::varyingTests[0].vertexOutputs = VERTEXT_NO_OP;
      createVaryingGeometryShaderTests::varyingTests[0].geometryOutputs = GEOMETRY_ONE;
      createVaryingGeometryShaderTests::varyingTests[0].name._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[0].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[0].name,
                 "vertex_no_op_geometry_out_1","");
      createVaryingGeometryShaderTests::varyingTests[0].desc._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[0].desc.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[0].desc,
                 "vertex_no_op_geometry_out_1","");
      createVaryingGeometryShaderTests::varyingTests[1].vertexOutputs = VERTEXT_ZERO;
      createVaryingGeometryShaderTests::varyingTests[1].geometryOutputs = GEOMETRY_ONE;
      createVaryingGeometryShaderTests::varyingTests[1].name._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[1].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[1].name,
                 "vertex_out_0_geometry_out_1","");
      createVaryingGeometryShaderTests::varyingTests[1].desc._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[1].desc.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[1].desc,
                 "vertex_out_0_geometry_out_1","");
      createVaryingGeometryShaderTests::varyingTests[2].vertexOutputs = VERTEXT_ZERO;
      createVaryingGeometryShaderTests::varyingTests[2].geometryOutputs = GEOMETRY_TWO;
      createVaryingGeometryShaderTests::varyingTests[2].name._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[2].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[2].name,
                 "vertex_out_0_geometry_out_2","");
      createVaryingGeometryShaderTests::varyingTests[2].desc._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[2].desc.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[2].desc,
                 "vertex_out_0_geometry_out_2","");
      createVaryingGeometryShaderTests::varyingTests[3].vertexOutputs = VERTEXT_ONE;
      createVaryingGeometryShaderTests::varyingTests[3].geometryOutputs = GEOMETRY_ZERO;
      createVaryingGeometryShaderTests::varyingTests[3].name._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[3].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[3].name,
                 "vertex_out_1_geometry_out_0","");
      createVaryingGeometryShaderTests::varyingTests[3].desc._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[3].desc.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[3].desc,
                 "vertex_out_1_geometry_out_0","");
      createVaryingGeometryShaderTests::varyingTests[4].vertexOutputs = VERTEXT_ONE;
      createVaryingGeometryShaderTests::varyingTests[4].geometryOutputs = GEOMETRY_TWO;
      createVaryingGeometryShaderTests::varyingTests[4].name._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[4].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[4].name,
                 "vertex_out_1_geometry_out_2","");
      createVaryingGeometryShaderTests::varyingTests[4].desc._M_dataplus._M_p =
           (pointer)&createVaryingGeometryShaderTests::varyingTests[4].desc.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[4].desc,
                 "vertex_out_1_geometry_out_2","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests);
    }
  }
  lVar2 = 0x30;
  do {
    node = (TestNode *)operator_new(0xb8);
    tcu::TestCase::TestCase
              ((TestCase *)node,testCtx,
               *(char **)(&shaderexecutor::
                           instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Fma,3>>()
                           ::s_instance + lVar2),*(char **)(lVar2 + 0xdac9c8));
    node->_vptr_TestNode = (_func_int **)&PTR__VaryingTest_00d7e520;
    node[1]._vptr_TestNode =
         *(_func_int ***)
          ((long)&shaderexecutor::
                  instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Fma,_3>_>
                  ::s_instance.
                  super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>,_3>
                  .m_func + lVar2);
    node[1].m_testCtx = (TestContext *)&node[1].m_name._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&node[1].m_testCtx,
               *(long *)(&shaderexecutor::
                          instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Fma,3>>()
                          ::s_instance + lVar2),
               *(long *)((long)&shaderexecutor::
                                instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Fma,_4>_>
                                ::s_instance.
                                super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>,_4>
                                .
                                super_PrimitiveFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
                                .
                                super_Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
                                .super_FuncBase._vptr_FuncBase + lVar2) +
               *(long *)(&shaderexecutor::
                          instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Fma,3>>()
                          ::s_instance + lVar2));
    *(size_type **)((long)&node[1].m_name.field_2 + 8) = &node[1].m_description._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&node[1].m_name.field_2 + 8),*(long *)(lVar2 + 0xdac9c8),
               *(long *)((long)&createVaryingGeometryShaderTests::varyingTests[0].vertexOutputs +
                        lVar2) + *(long *)(lVar2 + 0xdac9c8));
    tcu::TestNode::addChild(this,node);
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x198);
  return (TestCaseGroup *)this;
}

Assistant:

TestCaseGroup* createVaryingGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> varyingGroup	(new TestCaseGroup(testCtx, "varying",  "Test varyings."));

	// varying
	{
		static const VaryingTestSpec varyingTests[] =
		{
			{ VERTEXT_NO_OP,	GEOMETRY_ONE,	"vertex_no_op_geometry_out_1", "vertex_no_op_geometry_out_1" },
			{ VERTEXT_ZERO,		GEOMETRY_ONE,	"vertex_out_0_geometry_out_1", "vertex_out_0_geometry_out_1" },
			{ VERTEXT_ZERO,		GEOMETRY_TWO,	"vertex_out_0_geometry_out_2", "vertex_out_0_geometry_out_2" },
			{ VERTEXT_ONE,		GEOMETRY_ZERO,	"vertex_out_1_geometry_out_0", "vertex_out_1_geometry_out_0" },
			{ VERTEXT_ONE,		GEOMETRY_TWO,	"vertex_out_1_geometry_out_2", "vertex_out_1_geometry_out_2" },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(varyingTests); ++ndx)
			varyingGroup->addChild(new VaryingTest(testCtx, varyingTests[ndx]));
	}

	return varyingGroup.release();
}